

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

void ssl_write_encrypt_then_mac_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t *olen)

{
  mbedtls_ssl_ciphersuite_t *pmVar1;
  mbedtls_cipher_info_t *pmVar2;
  mbedtls_cipher_info_t *cipher;
  mbedtls_ssl_ciphersuite_t *suite;
  uchar *p;
  size_t *olen_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  if ((ssl->session_negotiate->encrypt_then_mac == 0) || (ssl->minor_ver == 0)) {
    *olen = 0;
  }
  else {
    pmVar1 = mbedtls_ssl_ciphersuite_from_id(ssl->session_negotiate->ciphersuite);
    if (((pmVar1 != (mbedtls_ssl_ciphersuite_t *)0x0) &&
        (pmVar2 = mbedtls_cipher_info_from_type(pmVar1->cipher),
        pmVar2 != (mbedtls_cipher_info_t *)0x0)) && (pmVar2->mode == MBEDTLS_MODE_CBC)) {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x738,"server hello, adding encrypt then mac extension");
      *buf = '\0';
      buf[1] = '\x16';
      buf[2] = '\0';
      buf[3] = '\0';
      *olen = 4;
      return;
    }
    *olen = 0;
  }
  return;
}

Assistant:

static void ssl_write_encrypt_then_mac_ext( mbedtls_ssl_context *ssl,
                                            unsigned char *buf,
                                            size_t *olen )
{
    unsigned char *p = buf;
    const mbedtls_ssl_ciphersuite_t *suite = NULL;
    const mbedtls_cipher_info_t *cipher = NULL;

    if( ssl->session_negotiate->encrypt_then_mac == MBEDTLS_SSL_EXTENDED_MS_DISABLED ||
        ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
    {
        *olen = 0;
        return;
    }

    /*
     * RFC 7366: "If a server receives an encrypt-then-MAC request extension
     * from a client and then selects a stream or Authenticated Encryption
     * with Associated Data (AEAD) ciphersuite, it MUST NOT send an
     * encrypt-then-MAC response extension back to the client."
     */
    if( ( suite = mbedtls_ssl_ciphersuite_from_id(
                    ssl->session_negotiate->ciphersuite ) ) == NULL ||
        ( cipher = mbedtls_cipher_info_from_type( suite->cipher ) ) == NULL ||
        cipher->mode != MBEDTLS_MODE_CBC )
    {
        *olen = 0;
        return;
    }

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, adding encrypt then mac extension" ) );

    *p++ = (unsigned char)( ( MBEDTLS_TLS_EXT_ENCRYPT_THEN_MAC >> 8 ) & 0xFF );
    *p++ = (unsigned char)( ( MBEDTLS_TLS_EXT_ENCRYPT_THEN_MAC      ) & 0xFF );

    *p++ = 0x00;
    *p++ = 0x00;

    *olen = 4;
}